

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

SharedPtr<deqp::egl::GLES2ThreadTest::Texture> __thiscall
deqp::egl::GLES2ThreadTest::GLES2ResourceManager::popTexture(GLES2ResourceManager *this,int index)

{
  int *piVar1;
  pointer pSVar2;
  SharedPtrStateBase *pSVar3;
  int in_EDX;
  SharedPtrStateBase *extraout_RDX;
  undefined4 in_register_00000034;
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
  *this_00;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> SVar4;
  
  this_00 = (vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
             *)CONCAT44(in_register_00000034,index);
  pSVar2 = (this_00->
           super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  (this->m_textures).
  super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pSVar2[in_EDX].m_ptr;
  pSVar3 = pSVar2[in_EDX].m_state;
  (this->m_textures).
  super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pSVar3;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
    UNLOCK();
    LOCK();
    piVar1 = (int *)((long)&((this->m_textures).
                             super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->m_state + 4);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
  ::_M_erase(this_00,(this_00->
                     super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + in_EDX);
  SVar4.m_state = extraout_RDX;
  SVar4.m_ptr = (Texture *)this;
  return SVar4;
}

Assistant:

SharedPtr<Texture> GLES2ResourceManager::popTexture (int index)
{
	SharedPtr<Texture> texture = m_textures[index];

	m_textures.erase(m_textures.begin() + index);

	return texture;
}